

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O3

void __thiscall
slang::ast::ValueExpressionBase::getLongestStaticPrefixesImpl
          (ValueExpressionBase *this,
          SmallVector<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>,_2UL>
          *results,Expression *longestStaticPrefix)

{
  uint uVar1;
  pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*> local_10;
  
  local_10.first = this->symbol;
  uVar1 = ((local_10.first)->super_Symbol).kind - Variable;
  if (((0x18 < uVar1) || ((0x1800c0fU >> (uVar1 & 0x1f) & 1) == 0)) ||
     (local_10.first[1].super_Symbol.kind != Unknown)) {
    if (longestStaticPrefix != (Expression *)0x0) {
      this = (ValueExpressionBase *)longestStaticPrefix;
    }
    local_10.second = &this->super_Expression;
    SmallVectorBase<std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>>::
    emplace_back<std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>>
              ((SmallVectorBase<std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>>
                *)results,&local_10);
  }
  return;
}

Assistant:

void ValueExpressionBase::getLongestStaticPrefixesImpl(
    SmallVector<std::pair<const ValueSymbol*, const Expression*>>& results,
    const Expression* longestStaticPrefix) const {

    // Automatic variables don't need to have drivers tracked.
    if (VariableSymbol::isKind(symbol.kind) &&
        symbol.as<VariableSymbol>().lifetime == VariableLifetime::Automatic) {
        return;
    }

    if (!longestStaticPrefix)
        longestStaticPrefix = this;
    results.push_back({&symbol, longestStaticPrefix});
}